

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalRangeJoin::LocalSortedTable::Sink
          (LocalSortedTable *this,DataChunk *input,GlobalSortState *global_sort_state)

{
  DataChunk *this_00;
  reference other;
  idx_t iVar1;
  DataChunk join_head;
  Vector primary;
  DataChunk DStack_c8;
  Vector local_88;
  
  if ((this->local_sort_state).initialized == false) {
    LocalSortState::Initialize
              (&this->local_sort_state,global_sort_state,global_sort_state->buffer_manager);
  }
  this_00 = &this->keys;
  DataChunk::Reset(this_00);
  ExpressionExecutor::Execute(&this->executor,input,this_00);
  other = vector<duckdb::Vector,_true>::get<true>(&this_00->data,0);
  Vector::Vector(&local_88,other);
  iVar1 = MergeNulls(this,&local_88,&(this->op->super_PhysicalComparisonJoin).conditions);
  this->has_null = this->has_null + iVar1;
  this->count = this->count + (this->keys).count;
  DataChunk::DataChunk(&DStack_c8);
  ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Vector&>
            ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&DStack_c8,&local_88);
  DStack_c8.count = (this->keys).count;
  LocalSortState::SinkChunk(&this->local_sort_state,&DStack_c8,input);
  DataChunk::~DataChunk(&DStack_c8);
  Vector::~Vector(&local_88);
  return;
}

Assistant:

void PhysicalRangeJoin::LocalSortedTable::Sink(DataChunk &input, GlobalSortState &global_sort_state) {
	// Initialize local state (if necessary)
	if (!local_sort_state.initialized) {
		local_sort_state.Initialize(global_sort_state, global_sort_state.buffer_manager);
	}

	// Obtain sorting columns
	keys.Reset();
	executor.Execute(input, keys);

	// Do not operate on primary key directly to avoid modifying the input chunk
	Vector primary = keys.data[0];
	// Count the NULLs so we can exclude them later
	has_null += MergeNulls(primary, op.conditions);
	count += keys.size();

	//	Only sort the primary key
	DataChunk join_head;
	join_head.data.emplace_back(primary);
	join_head.SetCardinality(keys.size());

	// Sink the data into the local sort state
	local_sort_state.SinkChunk(join_head, input);
}